

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O0

string * __thiscall
pstack::Dwarf::Unit::strx_abi_cxx11_(string *__return_storage_ptr__,Unit *this,size_t idx)

{
  bool bVar1;
  Exception *this_00;
  Exception *rhs;
  intmax_t iVar2;
  Off off_;
  unsigned_long end_;
  element_type *peVar3;
  uintmax_t uVar4;
  undefined1 local_280 [16];
  undefined1 local_270 [24];
  DWARFReader r;
  size_t len;
  Attribute local_208;
  long local_1d8;
  intmax_t base;
  Exception local_1c0;
  size_t local_20;
  size_t idx_local;
  Unit *this_local;
  
  local_20 = idx;
  idx_local = (size_t)this;
  this_local = (Unit *)__return_storage_ptr__;
  bVar1 = Elf::Section::operator_cast_to_bool(this->dwarf->debugStrOffsets);
  if (!bVar1) {
    base._3_1_ = 1;
    this_00 = (Exception *)__cxa_allocate_exception();
    memset(&local_1c0,0,0x1a0);
    Exception::Exception(&local_1c0);
    rhs = Exception::operator<<
                    (&local_1c0,(char (*) [44])"no string offsets table, but have strx form");
    Exception::Exception(this_00,rhs);
    base._3_1_ = 0;
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  root((DIE *)&len,this);
  DIE::attribute(&local_208,(DIE *)&len,DW_AT_str_offsets_base,false);
  iVar2 = DIE::Attribute::operator_cast_to_long(&local_208);
  DIE::Attribute::~Attribute(&local_208);
  DIE::~DIE((DIE *)&len);
  r._32_8_ = this->dwarfLen;
  local_1d8 = iVar2;
  Elf::Section::io((Section *)local_270);
  off_ = local_1d8 + r._32_8_ * local_20;
  end_ = std::numeric_limits<unsigned_long>::max();
  DWARFReader::DWARFReader((DWARFReader *)(local_270 + 0x10),(csptr *)local_270,off_,end_);
  std::shared_ptr<const_pstack::Reader>::~shared_ptr((shared_ptr<const_pstack::Reader> *)local_270);
  Elf::Section::io((Section *)local_280);
  peVar3 = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_280);
  uVar4 = DWARFReader::getuint((DWARFReader *)(local_270 + 0x10),r._32_8_);
  (*peVar3->_vptr_Reader[7])(__return_storage_ptr__,peVar3,uVar4);
  std::shared_ptr<const_pstack::Reader>::~shared_ptr((shared_ptr<const_pstack::Reader> *)local_280);
  DWARFReader::~DWARFReader((DWARFReader *)(local_270 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

std::string
Unit::strx(size_t idx) {
    if (!dwarf->debugStrOffsets)
        throw Exception() << "no string offsets table, but have strx form";
    // Get the root die, and the string offset base.
    auto base = intmax_t(root().attribute(DW_AT_str_offsets_base));
    auto len = dwarfLen;
    DWARFReader r(dwarf->debugStrOffsets.io(), base + len * idx);
    return dwarf->debugStrings.io()->readString(r.getuint(len));
}